

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVLABase<QByteArrayView>::reallocate_impl
          (QVLABase<QByteArrayView> *this,qsizetype prealloc,void *array,qsizetype asize,
          qsizetype aalloc)

{
  longlong lVar1;
  QByteArrayView *pQVar2;
  size_type sVar3;
  longlong *plVar4;
  QByteArrayView *pQVar5;
  QByteArrayView *in_RDX;
  long in_RSI;
  QVLABaseBase *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  qsizetype newA;
  void *newPtr;
  qsizetype copySize;
  qsizetype oalloc;
  QByteArrayView *oldPtr;
  malloced_ptr guard;
  qsizetype osize;
  pointer in_stack_ffffffffffffff68;
  QByteArrayView *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  qsizetype *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  long local_68;
  QByteArrayView *local_60;
  size_type local_20;
  long local_18;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_R8;
  pQVar2 = data((QVLABase<QByteArrayView> *)in_RDI);
  local_20 = QVLABaseBase::size(in_RDI);
  sVar3 = QVLABaseBase::capacity(in_RDI);
  plVar4 = qMin<long_long>(&local_10,&local_20);
  lVar1 = *plVar4;
  if (local_18 != sVar3) {
    std::unique_ptr<void,QVLABaseBase::free_deleter>::unique_ptr<QVLABaseBase::free_deleter,void>
              ((unique_ptr<void,_QVLABaseBase::free_deleter> *)in_stack_ffffffffffffff70);
    local_68 = in_RSI;
    local_60 = in_RDX;
    if (in_RSI < local_18) {
      local_60 = (QByteArrayView *)
                 QtPrivate::fittedMalloc
                           (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(size_t)in_RDI,
                            in_stack_ffffffffffffff78);
      std::unique_ptr<void,_QVLABaseBase::free_deleter>::reset
                ((unique_ptr<void,_QVLABaseBase::free_deleter> *)in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff68);
      if (local_60 == (QByteArrayView *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          qBadAlloc();
        }
        goto LAB_0036f7bb;
      }
      local_68 = local_18;
    }
    QtPrivate::q_uninitialized_relocate_n<QByteArrayView,long_long>
              (in_stack_ffffffffffffff70,(longlong)in_stack_ffffffffffffff68,
               (QByteArrayView *)0x36f6f3);
    in_RDI->ptr = local_60;
    std::unique_ptr<void,_QVLABaseBase::free_deleter>::release
              ((unique_ptr<void,_QVLABaseBase::free_deleter> *)0x36f70d);
    in_RDI->a = local_68;
    std::unique_ptr<void,_QVLABaseBase::free_deleter>::~unique_ptr
              ((unique_ptr<void,_QVLABaseBase::free_deleter> *)in_stack_ffffffffffffff70);
  }
  in_RDI->s = lVar1;
  if ((pQVar2 != in_RDX) && (pQVar5 = data((QVLABase<QByteArrayView> *)in_RDI), pQVar2 != pQVar5)) {
    QtPrivate::sizedFree(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,0x36f773);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_0036f7bb:
  __stack_chk_fail();
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QVLABase<T>::reallocate_impl(qsizetype prealloc, void *array, qsizetype asize, qsizetype aalloc)
{
    Q_ASSERT(aalloc >= asize);
    Q_ASSERT(data());
    T *oldPtr = data();
    qsizetype osize = size();
    const qsizetype oalloc = capacity();

    const qsizetype copySize = qMin(asize, osize);
    Q_ASSERT(copySize >= 0);

    if (aalloc != oalloc) {
        QVLABaseBase::malloced_ptr guard;
        void *newPtr;
        qsizetype newA;
        if (aalloc > prealloc) {
            newPtr = QtPrivate::fittedMalloc(0, &aalloc, sizeof(T));
            guard.reset(newPtr);
            Q_CHECK_PTR(newPtr); // could throw
            // by design: in case of QT_NO_EXCEPTIONS malloc must not fail or it crashes here
            newA = aalloc;
        } else {
            newPtr = array;
            newA = prealloc;
        }
        QtPrivate::q_uninitialized_relocate_n(oldPtr, copySize,
                                              reinterpret_cast<T *>(newPtr));
        // commit:
        ptr = newPtr;
        guard.release();
        a = newA;
    }
    s = copySize;

    // destroy remaining old objects
    if constexpr (QTypeInfo<T>::isComplex) {
        if (osize > asize)
            std::destroy(oldPtr + asize, oldPtr + osize);
    }

    if (oldPtr != reinterpret_cast<T *>(array) && oldPtr != data())
        QtPrivate::sizedFree(oldPtr, oalloc, sizeof(T));
}